

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O3

void av1_loop_restoration_save_boundary_lines
               (YV12_BUFFER_CONFIG *frame,AV1_COMMON *cm,int after_cdef)

{
  uint8_t uVar1;
  int row;
  uint use_highbd;
  RestorationStripeBoundaries *boundaries;
  int ss_y;
  int row_00;
  int plane;
  ulong uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int stripe;
  bool bVar6;
  uint local_54;
  
  uVar1 = cm->seq_params->monochrome;
  use_highbd = (uint)cm->seq_params->use_highbitdepth;
  uVar2 = 0;
LAB_003ae147:
  local_54 = 8;
  uVar5 = 0x40;
  bVar6 = false;
  if (uVar2 != 0) {
    bVar6 = cm->seq_params->subsampling_y != 0;
    uVar5 = 0x40 >> bVar6;
    local_54 = 8 >> bVar6;
  }
  iVar3 = (int)(((uint)(1 << bVar6) >> 1) + cm->height) >> bVar6;
  if (0 < iVar3) {
    boundaries = &cm->rst_info[uVar2].boundaries;
    iVar4 = -local_54;
    row_00 = 0;
    stripe = 0;
    do {
      iVar4 = uVar5 + iVar4;
      row = iVar3;
      if (iVar4 < iVar3) {
        row = iVar4;
      }
      plane = (int)uVar2;
      if (after_cdef == 0) {
        if (stripe != 0) {
          save_deblock_boundary_lines(frame,cm,plane,row_00 + -2,stripe,use_highbd,1,boundaries);
        }
        if (iVar3 <= iVar4) break;
        save_deblock_boundary_lines(frame,cm,plane,row,stripe,use_highbd,0,boundaries);
      }
      else {
        if (stripe == 0) {
          save_cdef_boundary_lines(frame,cm,plane,row_00,0,use_highbd,1,boundaries);
        }
        if (iVar3 <= iVar4) goto LAB_003ae27e;
      }
      stripe = stripe + 1;
      row_00 = stripe * uVar5 - local_54;
    } while( true );
  }
  goto LAB_003ae2b0;
LAB_003ae27e:
  save_cdef_boundary_lines(frame,cm,plane,row + -1,stripe,use_highbd,0,boundaries);
LAB_003ae2b0:
  if ((uVar1 != '\0') || (bVar6 = 1 < uVar2, uVar2 = uVar2 + 1, bVar6)) {
    return;
  }
  goto LAB_003ae147;
}

Assistant:

void av1_loop_restoration_save_boundary_lines(const YV12_BUFFER_CONFIG *frame,
                                              AV1_COMMON *cm, int after_cdef) {
  const int num_planes = av1_num_planes(cm);
  const int use_highbd = cm->seq_params->use_highbitdepth;
  for (int p = 0; p < num_planes; ++p) {
    save_boundary_lines(frame, use_highbd, p, cm, after_cdef);
  }
}